

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

void __thiscall SimpleString::SimpleString(SimpleString *this,char *other,size_t repeatCount)

{
  char cVar1;
  char *result;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  
  this->buffer_ = (char *)0x0;
  this->bufferSize_ = 0;
  sVar4 = 1 - repeatCount;
  lVar5 = -1;
  do {
    sVar4 = sVar4 + repeatCount;
    lVar3 = lVar5 + 1;
    lVar5 = lVar5 + 1;
  } while (other[lVar3] != '\0');
  setInternalBufferToNewBuffer(this,sVar4);
  pcVar2 = this->buffer_;
  if (repeatCount != 0) {
    sVar4 = 0;
    do {
      if (pcVar2 != (char *)0x0 && lVar5 != -1) {
        lVar3 = 0;
        do {
          cVar1 = other[lVar3];
          pcVar2[lVar3] = cVar1;
          if (cVar1 == '\0') break;
          bVar6 = lVar5 != lVar3;
          lVar3 = lVar3 + 1;
        } while (bVar6);
      }
      pcVar2 = pcVar2 + lVar5;
      sVar4 = sVar4 + 1;
    } while (sVar4 != repeatCount);
  }
  *pcVar2 = '\0';
  return;
}

Assistant:

SimpleString::SimpleString(const char *other, size_t repeatCount)
    : buffer_(NULLPTR), bufferSize_(0)
{
    size_t otherStringLength = StrLen(other);
    setInternalBufferToNewBuffer(otherStringLength * repeatCount + 1);

    char* next = buffer_;
    for (size_t i = 0; i < repeatCount; i++) {
        StrNCpy(next, other, otherStringLength + 1);
        next += otherStringLength;
    }
    *next = 0;
}